

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O3

int32_t __thiscall
icu_63::CollationRuleParser::parseString
          (CollationRuleParser *this,int32_t i,UnicodeString *raw,UErrorCode *errorCode)

{
  uint offset;
  ushort uVar1;
  short sVar2;
  UBool UVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined8 in_RAX;
  char *pcVar7;
  ushort uVar8;
  char16_t cVar9;
  uint uVar10;
  int32_t offset_00;
  UnicodeString *this_00;
  char16_t *pcVar11;
  uint uVar12;
  uint uVar13;
  undefined8 uStack_38;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar1 = (raw->fUnion).fStackFields.fLengthAndFlags;
    uVar8 = 2;
    if ((uVar1 & 1) == 0) {
      uVar8 = uVar1 & 0x1e;
    }
    (raw->fUnion).fStackFields.fLengthAndFlags = uVar8;
    this_00 = this->rules;
    sVar2 = (this_00->fUnion).fStackFields.fLengthAndFlags;
    uVar10 = (uint)sVar2;
    uVar5 = (this_00->fUnion).fFields.fLength;
    uVar13 = (int)uVar10 >> 5;
    if (sVar2 < 0) {
      uVar13 = uVar5;
    }
    uStack_38 = in_RAX;
    if (i < (int)uVar13) {
      do {
        offset = i + 1;
        if ((uint)i < uVar13) {
          if ((uVar10 & 2) == 0) {
            pcVar11 = (this_00->fUnion).fFields.fArray;
          }
          else {
            pcVar11 = (char16_t *)((long)&this_00->fUnion + 2);
          }
          cVar9 = pcVar11[i];
          uVar4 = (uint)(ushort)cVar9;
          if (0x5d < (ushort)cVar9 - 0x21) goto LAB_0024de2f;
          if ((ushort)cVar9 < 0x30) {
LAB_0024dcd5:
            if (cVar9 != L'\'') break;
            if ((uVar13 <= offset || (int)uVar13 <= (int)offset) || (pcVar11[(int)offset] != L'\''))
            {
              uVar4 = (int)(short)uVar10 >> 5;
              if ((short)uVar10 < 0) {
                uVar4 = uVar5;
              }
              uVar13 = offset;
              if (offset != uVar4) {
                do {
                  uVar13 = offset + 1;
                  cVar9 = L'\xffff';
                  if (offset < uVar4) {
                    if ((uVar10 & 2) == 0) {
                      pcVar11 = (this_00->fUnion).fFields.fArray;
                    }
                    else {
                      pcVar11 = (char16_t *)((long)&this_00->fUnion + 2);
                    }
                    cVar9 = pcVar11[(int)offset];
                    if (cVar9 == L'\'') {
                      i = uVar13;
                      if ((uVar4 <= uVar13 || (int)uVar4 <= (int)uVar13) ||
                         (pcVar11[(int)uVar13] != L'\'')) goto LAB_0024de56;
                      uVar13 = offset + 2;
                      cVar9 = L'\'';
                    }
                  }
                  uStack_38._0_4_ = CONCAT22(cVar9,(undefined2)uStack_38);
                  UnicodeString::doAppend(raw,(UChar *)((long)&uStack_38 + 2),0,1);
                  this_00 = this->rules;
                  sVar2 = (this_00->fUnion).fStackFields.fLengthAndFlags;
                  uVar10 = (uint)sVar2;
                  if (sVar2 < 0) {
                    uVar4 = (this_00->fUnion).fFields.fLength;
                  }
                  else {
                    uVar4 = (int)uVar10 >> 5;
                  }
                  offset = uVar13;
                  if (uVar13 == uVar4) break;
                } while( true );
              }
              if (U_ZERO_ERROR < *errorCode) {
                return uVar13;
              }
              *errorCode = U_INVALID_FORMAT_ERROR;
              pcVar7 = "quoted literal text missing terminating apostrophe";
              goto LAB_0024df21;
            }
            uStack_38._0_6_ = CONCAT24(0x27,(undefined4)uStack_38);
            UnicodeString::doAppend(raw,(UChar *)((long)&uStack_38 + 4),0,1);
            i = i + 2;
          }
          else {
            uVar12 = (ushort)cVar9 - 0x3a;
            if (0x26 < uVar12) {
LAB_0024de25:
              if ((ushort)cVar9 < 0x7b) goto LAB_0024de2f;
              goto LAB_0024dcd5;
            }
            if ((ulong)uVar12 != 0x22) {
              if ((0x7a0000007fU >> ((ulong)uVar12 & 0x3f) & 1) == 0) goto LAB_0024de25;
              break;
            }
            if (offset == uVar13) {
              if (U_ZERO_ERROR < *errorCode) {
                return uVar13;
              }
              *errorCode = U_INVALID_FORMAT_ERROR;
              this->errorReason = "backslash escape at the end of the rule string";
              if (this->parseError == (UParseError *)0x0) {
                return uVar13;
              }
              goto LAB_0024df2f;
            }
            uVar5 = UnicodeString::char32At(this_00,offset);
            UnicodeString::append(raw,uVar5);
            i = (offset - (uVar5 < 0x10000)) + 2;
          }
        }
        else {
          uVar4 = 0xffff;
          cVar9 = L'\xffff';
LAB_0024de2f:
          UVar3 = PatternProps::isWhiteSpace(uVar4);
          if (UVar3 != '\0') break;
          uStack_38 = CONCAT26(cVar9,(undefined6)uStack_38);
          UnicodeString::doAppend(raw,(UChar *)((long)&uStack_38 + 6),0,1);
          i = offset;
        }
LAB_0024de56:
        this_00 = this->rules;
        sVar2 = (this_00->fUnion).fStackFields.fLengthAndFlags;
        uVar10 = (uint)sVar2;
        uVar5 = (this_00->fUnion).fFields.fLength;
        uVar13 = (int)uVar10 >> 5;
        if (sVar2 < 0) {
          uVar13 = uVar5;
        }
      } while (i < (int)uVar13);
      uVar8 = (raw->fUnion).fStackFields.fLengthAndFlags;
    }
    if ((short)uVar8 < 0) {
      iVar6 = (raw->fUnion).fFields.fLength;
    }
    else {
      iVar6 = (int)(short)uVar8 >> 5;
    }
    if (0 < iVar6) {
      offset_00 = 0;
      do {
        uVar5 = UnicodeString::char32At(raw,offset_00);
        uVar13 = i;
        if ((uVar5 & 0xfffff800) == 0xd800) {
          if (U_ZERO_ERROR < *errorCode) {
            return i;
          }
          *errorCode = U_INVALID_FORMAT_ERROR;
          pcVar7 = "string contains an unpaired surrogate";
          goto LAB_0024df21;
        }
        if (uVar5 - 0xfffd < 3) {
          if (U_ZERO_ERROR < *errorCode) {
            return i;
          }
          *errorCode = U_INVALID_FORMAT_ERROR;
          pcVar7 = "string contains U+FFFD, U+FFFE or U+FFFF";
LAB_0024df21:
          this->errorReason = pcVar7;
          if (this->parseError == (UParseError *)0x0) {
            return uVar13;
          }
LAB_0024df2f:
          setErrorContext(this);
          return uVar13;
        }
        sVar2 = (raw->fUnion).fStackFields.fLengthAndFlags;
        if (sVar2 < 0) {
          iVar6 = (raw->fUnion).fFields.fLength;
        }
        else {
          iVar6 = (int)sVar2 >> 5;
        }
        offset_00 = (offset_00 - (uint)(uVar5 < 0x10000)) + 2;
      } while (offset_00 < iVar6);
    }
  }
  return i;
}

Assistant:

int32_t
CollationRuleParser::parseString(int32_t i, UnicodeString &raw, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return i; }
    raw.remove();
    while(i < rules->length()) {
        UChar32 c = rules->charAt(i++);
        if(isSyntaxChar(c)) {
            if(c == 0x27) {  // apostrophe
                if(i < rules->length() && rules->charAt(i) == 0x27) {
                    // Double apostrophe, encodes a single one.
                    raw.append((UChar)0x27);
                    ++i;
                    continue;
                }
                // Quote literal text until the next single apostrophe.
                for(;;) {
                    if(i == rules->length()) {
                        setParseError("quoted literal text missing terminating apostrophe", errorCode);
                        return i;
                    }
                    c = rules->charAt(i++);
                    if(c == 0x27) {
                        if(i < rules->length() && rules->charAt(i) == 0x27) {
                            // Double apostrophe inside quoted literal text,
                            // still encodes a single apostrophe.
                            ++i;
                        } else {
                            break;
                        }
                    }
                    raw.append((UChar)c);
                }
            } else if(c == 0x5c) {  // backslash
                if(i == rules->length()) {
                    setParseError("backslash escape at the end of the rule string", errorCode);
                    return i;
                }
                c = rules->char32At(i);
                raw.append(c);
                i += U16_LENGTH(c);
            } else {
                // Any other syntax character terminates a string.
                --i;
                break;
            }
        } else if(PatternProps::isWhiteSpace(c)) {
            // Unquoted white space terminates a string.
            --i;
            break;
        } else {
            raw.append((UChar)c);
        }
    }
    for(int32_t j = 0; j < raw.length();) {
        UChar32 c = raw.char32At(j);
        if(U_IS_SURROGATE(c)) {
            setParseError("string contains an unpaired surrogate", errorCode);
            return i;
        }
        if(0xfffd <= c && c <= 0xffff) {
            setParseError("string contains U+FFFD, U+FFFE or U+FFFF", errorCode);
            return i;
        }
        j += U16_LENGTH(c);
    }
    return i;
}